

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O0

void __thiscall OpenSSLWrapper::SslContext::SslContext(SslContext *this,SSL_METHOD *sslMethod)

{
  SSL_CTX *pSVar1;
  SSL_METHOD *sslMethod_local;
  SslContext *this_local;
  
  this->_vptr_SslContext = (_func_int **)&PTR__SslContext_001b8980;
  pSVar1 = SSL_CTX_new((SSL_METHOD *)sslMethod);
  this->m_ctx = (SSL_CTX *)pSVar1;
  std::__cxx11::string::string((string *)&this->m_strCertComName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_vstrAltNames);
  return;
}

Assistant:

SslContext::SslContext(const SSL_METHOD* sslMethod) noexcept : m_ctx(SSL_CTX_new(sslMethod))
    {
    }